

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  ulong uVar12;
  ulong unaff_RBX;
  size_t mask;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  ulong local_1468;
  int local_1444;
  RTCIntersectArguments *local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  ulong local_1418;
  ulong local_1410;
  NodeRef *local_1408;
  RayQueryContext *local_1400;
  ulong local_13f8;
  Scene *local_13f0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_1408 = stack + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl((undefined1  [16])aVar2,auVar20);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar20,auVar32,1);
      bVar18 = (bool)((byte)uVar17 & 1);
      auVar33._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.x;
      bVar18 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.y;
      bVar18 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * (int)aVar2.z;
      bVar18 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * aVar2.field_3.a;
      auVar20 = vrcp14ps_avx512vl(auVar33);
      auVar21._8_4_ = 0x3f800000;
      auVar21._0_8_ = &DAT_3f8000003f800000;
      auVar21._12_4_ = 0x3f800000;
      auVar21 = vfnmadd213ps_avx512vl(auVar33,auVar20,auVar21);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar33 = vfmadd132ps_fma(auVar21,auVar20,auVar20);
      auVar34 = vbroadcastss_avx512vl(auVar33);
      auVar54 = ZEXT3264(auVar34);
      auVar20 = vmovshdup_avx(auVar33);
      auVar34 = vbroadcastsd_avx512vl(auVar20);
      auVar55 = ZEXT3264(auVar34);
      auVar21 = vshufpd_avx(auVar33,auVar33,1);
      auVar35._8_4_ = 2;
      auVar35._0_8_ = 0x200000002;
      auVar35._12_4_ = 2;
      auVar35._16_4_ = 2;
      auVar35._20_4_ = 2;
      auVar35._24_4_ = 2;
      auVar35._28_4_ = 2;
      auVar34 = vpermps_avx512vl(auVar35,ZEXT1632(auVar33));
      auVar56 = ZEXT3264(auVar34);
      fVar39 = auVar33._0_4_ * (ray->org).field_0.m128[0];
      auVar46._4_4_ = fVar39;
      auVar46._0_4_ = fVar39;
      auVar46._8_4_ = fVar39;
      auVar46._12_4_ = fVar39;
      auVar46._16_4_ = fVar39;
      auVar46._20_4_ = fVar39;
      auVar46._24_4_ = fVar39;
      auVar46._28_4_ = fVar39;
      auVar34._8_4_ = 1;
      auVar34._0_8_ = 0x100000001;
      auVar34._12_4_ = 1;
      auVar34._16_4_ = 1;
      auVar34._20_4_ = 1;
      auVar34._24_4_ = 1;
      auVar34._28_4_ = 1;
      auVar36 = ZEXT1632(CONCAT412(auVar33._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar33._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar33._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar39))));
      auVar34 = vpermps_avx2(auVar34,auVar36);
      auVar36 = vpermps_avx2(auVar35,auVar36);
      local_1410 = (ulong)(auVar33._0_4_ < 0.0) << 5;
      local_1418 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      local_1420 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x80;
      local_1428 = local_1410 ^ 0x20;
      local_1430 = local_1418 ^ 0x20;
      uVar17 = local_1420 ^ 0x20;
      auVar35 = vbroadcastss_avx512vl(auVar22);
      auVar57 = ZEXT3264(auVar35);
      auVar37._8_4_ = 0x80000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar37._12_4_ = 0x80000000;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar58 = ZEXT3264(auVar35);
      auVar35 = vxorps_avx512vl(auVar46,auVar37);
      auVar59 = ZEXT3264(auVar35);
      auVar34 = vxorps_avx512vl(auVar34,auVar37);
      auVar60 = ZEXT3264(auVar34);
      auVar34 = vxorps_avx512vl(auVar36,auVar37);
      auVar61 = ZEXT3264(auVar34);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar62 = ZEXT1664(auVar22);
      auVar22 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar63 = ZEXT1664(auVar22);
      auVar22 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      auVar64 = ZEXT1664(auVar22);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar65 = ZEXT1664(auVar22);
      local_1400 = context;
      local_1438 = uVar17;
      do {
        if (local_1408 == stack) {
          return;
        }
        sVar15 = local_1408[-1].ptr;
        local_1408 = local_1408 + -1;
        do {
          if ((sVar15 & 8) == 0) {
            uVar11 = sVar15 & 0xfffffffffffffff0;
            uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar38._4_4_ = uVar1;
            auVar38._0_4_ = uVar1;
            auVar38._8_4_ = uVar1;
            auVar38._12_4_ = uVar1;
            auVar38._16_4_ = uVar1;
            auVar38._20_4_ = uVar1;
            auVar38._24_4_ = uVar1;
            auVar38._28_4_ = uVar1;
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_1410),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + local_1410));
            auVar34 = vfmadd213ps_avx512vl(ZEXT1632(auVar22),auVar54._0_32_,auVar59._0_32_);
            auVar36 = vmaxps_avx512vl(auVar57._0_32_,auVar34);
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_1418),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + local_1418));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_1420),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + local_1420));
            auVar34 = vfmadd213ps_avx512vl(ZEXT1632(auVar22),auVar55._0_32_,auVar60._0_32_);
            auVar35 = vfmadd213ps_avx512vl(ZEXT1632(auVar20),auVar56._0_32_,auVar61._0_32_);
            auVar34 = vmaxps_avx(auVar34,auVar35);
            auVar34 = vmaxps_avx(auVar36,auVar34);
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_1428),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + local_1428));
            auVar36 = vfmadd213ps_avx512vl(ZEXT1632(auVar22),auVar54._0_32_,auVar59._0_32_);
            auVar35 = vminps_avx512vl(auVar58._0_32_,auVar36);
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + local_1430),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + local_1430));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar17),auVar38,
                                      *(undefined1 (*) [32])(uVar11 + 0x40 + uVar17));
            auVar36 = vfmadd213ps_avx512vl(ZEXT1632(auVar22),auVar55._0_32_,auVar60._0_32_);
            auVar37 = vfmadd213ps_avx512vl(ZEXT1632(auVar20),auVar56._0_32_,auVar61._0_32_);
            auVar36 = vminps_avx(auVar36,auVar37);
            auVar36 = vminps_avx(auVar35,auVar36);
            if (((uint)sVar15 & 7) == 6) {
              uVar7 = vcmpps_avx512vl(auVar34,auVar36,2);
              uVar4 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])(uVar11 + 0x1c0),0xd);
              uVar5 = vcmpps_avx512vl(auVar38,*(undefined1 (*) [32])(uVar11 + 0x1e0),1);
              bVar19 = (byte)uVar7 & (byte)uVar4 & (byte)uVar5;
            }
            else {
              uVar7 = vcmpps_avx512vl(auVar34,auVar36,2);
              bVar19 = (byte)uVar7;
            }
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar19);
          }
          if ((sVar15 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar13 = 4;
            }
            else {
              uVar14 = sVar15 & 0xfffffffffffffff0;
              lVar16 = 0;
              for (uVar11 = unaff_RBX; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000)
              {
                lVar16 = lVar16 + 1;
              }
              iVar13 = 0;
              for (uVar11 = unaff_RBX - 1 & unaff_RBX; sVar15 = *(size_t *)(uVar14 + lVar16 * 8),
                  uVar11 != 0; uVar11 = uVar11 - 1 & uVar11) {
                local_1408->ptr = sVar15;
                local_1408 = local_1408 + 1;
                lVar16 = 0;
                for (uVar12 = uVar11; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
              }
            }
          }
          else {
            iVar13 = 6;
          }
        } while (iVar13 == 0);
        if (iVar13 == 6) {
          local_13f8 = (ulong)((uint)sVar15 & 0xf) - 8;
          bVar18 = local_13f8 != 0;
          if (bVar18) {
            uVar11 = sVar15 & 0xfffffffffffffff0;
            uVar14 = 0;
            do {
              lVar16 = uVar14 * 0x140;
              uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
              auVar31._4_4_ = uVar1;
              auVar31._0_4_ = uVar1;
              auVar31._8_4_ = uVar1;
              auVar31._12_4_ = uVar1;
              auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x90 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + lVar16));
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xa0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x10 + lVar16));
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xb0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x20 + lVar16));
              auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xc0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x30 + lVar16));
              auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xd0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x40 + lVar16));
              auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xe0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x50 + lVar16));
              auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xf0 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x60 + lVar16));
              auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x100 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x70 + lVar16));
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x110 + lVar16),auVar31,
                                        *(undefined1 (*) [16])(uVar11 + 0x80 + lVar16));
              auVar22 = vsubps_avx(auVar26,auVar22);
              auVar20 = vsubps_avx(auVar25,auVar20);
              auVar21 = vsubps_avx(auVar27,auVar21);
              auVar33 = vsubps_avx(auVar33,auVar26);
              auVar32 = vsubps_avx(auVar32,auVar25);
              auVar31 = vsubps_avx(auVar31,auVar27);
              auVar24._0_4_ = auVar20._0_4_ * auVar31._0_4_;
              auVar24._4_4_ = auVar20._4_4_ * auVar31._4_4_;
              auVar24._8_4_ = auVar20._8_4_ * auVar31._8_4_;
              auVar24._12_4_ = auVar20._12_4_ * auVar31._12_4_;
              local_1308 = vfmsub231ps_fma(auVar24,auVar32,auVar21);
              auVar28._0_4_ = auVar21._0_4_ * auVar33._0_4_;
              auVar28._4_4_ = auVar21._4_4_ * auVar33._4_4_;
              auVar28._8_4_ = auVar21._8_4_ * auVar33._8_4_;
              auVar28._12_4_ = auVar21._12_4_ * auVar33._12_4_;
              local_12f8 = vfmsub231ps_fma(auVar28,auVar31,auVar22);
              auVar29._0_4_ = auVar22._0_4_ * auVar32._0_4_;
              auVar29._4_4_ = auVar22._4_4_ * auVar32._4_4_;
              auVar29._8_4_ = auVar22._8_4_ * auVar32._8_4_;
              auVar29._12_4_ = auVar22._12_4_ * auVar32._12_4_;
              uVar1 = *(undefined4 *)&(ray->dir).field_0;
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar51._4_4_ = uVar1;
              auVar51._0_4_ = uVar1;
              auVar51._8_4_ = uVar1;
              auVar51._12_4_ = uVar1;
              fVar39 = (ray->dir).field_0.m128[2];
              auVar52._4_4_ = fVar39;
              auVar52._0_4_ = fVar39;
              auVar52._8_4_ = fVar39;
              auVar52._12_4_ = fVar39;
              uVar1 = *(undefined4 *)&(ray->org).field_0;
              auVar23._4_4_ = uVar1;
              auVar23._0_4_ = uVar1;
              auVar23._8_4_ = uVar1;
              auVar23._12_4_ = uVar1;
              auVar23 = vsubps_avx512vl(auVar26,auVar23);
              local_12e8 = vfmsub231ps_fma(auVar29,auVar33,auVar20);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar24 = vsubps_avx512vl(auVar25,auVar26);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25 = vsubps_avx512vl(auVar27,auVar25);
              auVar26 = vmulps_avx512vl(auVar51,auVar25);
              auVar27 = vfmsub231ps_avx512vl(auVar26,auVar24,auVar52);
              auVar26 = vmulps_avx512vl(auVar52,auVar23);
              auVar28 = vfmsub231ps_avx512vl(auVar26,auVar25,auVar30);
              auVar26 = vmulps_avx512vl(auVar30,auVar24);
              auVar29 = vfmsub231ps_avx512vl(auVar26,auVar23,auVar51);
              auVar53._0_4_ = fVar39 * local_12e8._0_4_;
              auVar53._4_4_ = fVar39 * local_12e8._4_4_;
              auVar53._8_4_ = fVar39 * local_12e8._8_4_;
              auVar53._12_4_ = fVar39 * local_12e8._12_4_;
              auVar26 = vfmadd231ps_fma(auVar53,local_12f8,auVar51);
              auVar26 = vfmadd231ps_fma(auVar26,local_1308,auVar30);
              auVar30 = vandps_avx512vl(auVar26,auVar62._0_16_);
              auVar31 = vmulps_avx512vl(auVar31,auVar29);
              auVar32 = vfmadd231ps_avx512vl(auVar31,auVar28,auVar32);
              auVar33 = vfmadd231ps_avx512vl(auVar32,auVar27,auVar33);
              auVar32 = vandps_avx512vl(auVar26,auVar63._0_16_);
              uVar47 = auVar32._0_4_;
              auVar45._0_4_ = (float)(uVar47 ^ auVar33._0_4_);
              uVar48 = auVar32._4_4_;
              auVar45._4_4_ = (float)(uVar48 ^ auVar33._4_4_);
              uVar49 = auVar32._8_4_;
              auVar45._8_4_ = (float)(uVar49 ^ auVar33._8_4_);
              uVar50 = auVar32._12_4_;
              auVar45._12_4_ = (float)(uVar50 ^ auVar33._12_4_);
              auVar21 = vmulps_avx512vl(auVar21,auVar29);
              auVar20 = vfmadd231ps_avx512vl(auVar21,auVar20,auVar28);
              auVar22 = vfmadd231ps_avx512vl(auVar20,auVar22,auVar27);
              auVar27._0_4_ = (float)(uVar47 ^ auVar22._0_4_);
              auVar27._4_4_ = (float)(uVar48 ^ auVar22._4_4_);
              auVar27._8_4_ = (float)(uVar49 ^ auVar22._8_4_);
              auVar27._12_4_ = (float)(uVar50 ^ auVar22._12_4_);
              auVar22 = auVar64._0_16_;
              uVar7 = vcmpps_avx512vl(auVar45,auVar22,5);
              uVar4 = vcmpps_avx512vl(auVar27,auVar22,5);
              uVar5 = vcmpps_avx512vl(auVar26,auVar22,4);
              auVar22._0_4_ = auVar27._0_4_ + auVar45._0_4_;
              auVar22._4_4_ = auVar27._4_4_ + auVar45._4_4_;
              auVar22._8_4_ = auVar27._8_4_ + auVar45._8_4_;
              auVar22._12_4_ = auVar27._12_4_ + auVar45._12_4_;
              uVar6 = vcmpps_avx512vl(auVar22,auVar30,2);
              bVar19 = (byte)uVar7 & (byte)uVar4 & (byte)uVar5 & (byte)uVar6;
              if (bVar19 != 0) {
                auVar44._0_4_ = local_12e8._0_4_ * auVar25._0_4_;
                auVar44._4_4_ = local_12e8._4_4_ * auVar25._4_4_;
                auVar44._8_4_ = local_12e8._8_4_ * auVar25._8_4_;
                auVar44._12_4_ = local_12e8._12_4_ * auVar25._12_4_;
                auVar22 = vfmadd213ps_fma(auVar24,local_12f8,auVar44);
                auVar22 = vfmadd213ps_fma(auVar23,local_1308,auVar22);
                auVar43._0_4_ = (float)(uVar47 ^ auVar22._0_4_);
                auVar43._4_4_ = (float)(uVar48 ^ auVar22._4_4_);
                auVar43._8_4_ = (float)(uVar49 ^ auVar22._8_4_);
                auVar43._12_4_ = (float)(uVar50 ^ auVar22._12_4_);
                uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar8._4_4_ = uVar1;
                auVar8._0_4_ = uVar1;
                auVar8._8_4_ = uVar1;
                auVar8._12_4_ = uVar1;
                auVar22 = vmulps_avx512vl(auVar30,auVar8);
                fVar39 = ray->tfar;
                auVar9._4_4_ = fVar39;
                auVar9._0_4_ = fVar39;
                auVar9._8_4_ = fVar39;
                auVar9._12_4_ = fVar39;
                auVar20 = vmulps_avx512vl(auVar30,auVar9);
                uVar7 = vcmpps_avx512vl(auVar43,auVar20,2);
                uVar4 = vcmpps_avx512vl(auVar22,auVar43,1);
                bVar19 = (byte)uVar7 & (byte)uVar4 & bVar19;
                if (bVar19 != 0) {
                  auVar22 = vrcp14ps_avx512vl(auVar30);
                  auVar20 = vfnmadd213ps_avx512vl(auVar30,auVar22,auVar65._0_16_);
                  auVar22 = vfmadd132ps_fma(auVar20,auVar22,auVar22);
                  fVar39 = auVar22._0_4_;
                  fVar40 = auVar22._4_4_;
                  fVar41 = auVar22._8_4_;
                  fVar42 = auVar22._12_4_;
                  local_1318[0] = fVar39 * auVar43._0_4_;
                  local_1318[1] = fVar40 * auVar43._4_4_;
                  local_1318[2] = fVar41 * auVar43._8_4_;
                  local_1318[3] = fVar42 * auVar43._12_4_;
                  local_1338[0] = fVar39 * auVar45._0_4_;
                  local_1338[1] = fVar40 * auVar45._4_4_;
                  local_1338[2] = fVar41 * auVar45._8_4_;
                  local_1338[3] = fVar42 * auVar45._12_4_;
                  local_13f0 = local_1400->scene;
                  local_1328._0_4_ = fVar39 * auVar27._0_4_;
                  local_1328._4_4_ = fVar40 * auVar27._4_4_;
                  local_1328._8_4_ = fVar41 * auVar27._8_4_;
                  local_1328._12_4_ = fVar42 * auVar27._12_4_;
                  local_1468 = (ulong)bVar19;
                  do {
                    auVar22 = auVar64._0_16_;
                    uVar17 = 0;
                    for (uVar12 = local_1468; (uVar12 & 1) == 0;
                        uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                      uVar17 = uVar17 + 1;
                    }
                    h.geomID = *(uint *)(lVar16 + uVar11 + 0x120 + uVar17 * 4);
                    pGVar3 = (local_13f0->geometries).items[h.geomID].ptr;
                    if ((pGVar3->mask & ray->mask) == 0) {
                      local_1468 = local_1468 ^ 1L << (uVar17 & 0x3f);
                      bVar10 = true;
                    }
                    else {
                      local_1440 = local_1400->args;
                      if ((local_1440->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar10 = false;
                      }
                      else {
                        local_12d8 = auVar61._0_32_;
                        local_12b8 = auVar60._0_32_;
                        local_1298 = auVar59._0_32_;
                        local_1278 = auVar58._0_32_;
                        local_1258 = auVar57._0_32_;
                        local_1238 = auVar56._0_32_;
                        local_1218 = auVar55._0_32_;
                        local_11f8 = auVar54._0_32_;
                        uVar12 = (ulong)(uint)((int)uVar17 * 4);
                        h.u = *(float *)((long)local_1338 + uVar12);
                        h.v = *(float *)(local_1328 + uVar12);
                        args.context = local_1400->user;
                        h.primID = *(uint *)(lVar16 + uVar11 + 0x130 + uVar12);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar12);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar12);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_12e8 + uVar12);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar39 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1318 + uVar12);
                        local_1444 = -1;
                        args.valid = &local_1444;
                        args.geometryUserPtr = pGVar3->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar3->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (local_1440->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1440->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                              (*local_1440->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_0072485c;
                          }
                          bVar10 = false;
                        }
                        else {
LAB_0072485c:
                          ray->tfar = fVar39;
                          local_1468 = local_1468 ^ 1L << (uVar17 & 0x3f);
                          bVar10 = true;
                        }
                        auVar54 = ZEXT3264(local_11f8);
                        auVar55 = ZEXT3264(local_1218);
                        auVar56 = ZEXT3264(local_1238);
                        auVar57 = ZEXT3264(local_1258);
                        auVar58 = ZEXT3264(local_1278);
                        auVar59 = ZEXT3264(local_1298);
                        auVar60 = ZEXT3264(local_12b8);
                        auVar61 = ZEXT3264(local_12d8);
                        auVar20 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar62 = ZEXT1664(auVar20);
                        auVar20 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                        auVar63 = ZEXT1664(auVar20);
                        auVar22 = vxorps_avx512vl(auVar22,auVar22);
                        auVar64 = ZEXT1664(auVar22);
                        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar65 = ZEXT1664(auVar22);
                      }
                    }
                    if (!bVar10) {
                      iVar13 = 0;
                      uVar17 = local_1438;
                      if (bVar18) {
                        ray->tfar = -INFINITY;
                        iVar13 = 3;
                      }
                      goto LAB_00724932;
                    }
                  } while (local_1468 != 0);
                }
              }
              uVar14 = uVar14 + 1;
              bVar18 = uVar14 < local_13f8;
              uVar17 = local_1438;
            } while (uVar14 != local_13f8);
          }
          iVar13 = 0;
        }
LAB_00724932:
      } while (iVar13 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }